

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyCleanStyle(TidyDocImpl *doc,Node *html)

{
  int iVar1;
  Node *node;
  Node *element;
  Node *node_00;
  Stack *stack;
  uint code;
  
  if (html != (Node *)0x0) {
    iVar1 = *(int *)((doc->config).value + 0x52);
    element = prvTidyFindHEAD(doc);
    node_00 = prvTidyFindBody(doc);
    if (node_00 != (Node *)0x0 && element != (Node *)0x0) {
      stack = prvTidynewStack(doc,0x10);
      do {
        while( true ) {
          if (node_00 == (Node *)0x0) {
            prvTidyfreeStack(stack);
            return;
          }
          node = node_00->next;
          if ((node_00->tag == (Dict *)0x0) || (node_00->tag->id != TidyTag_STYLE)) break;
          if (iVar1 == 0) {
            code = 0x241;
          }
          else {
            prvTidyRemoveNode(node_00);
            prvTidyInsertNodeAtEnd(element,node_00);
            code = 0x263;
          }
          prvTidyReport(doc,node_00,element,code);
LAB_0014a0a1:
          node_00 = node;
          if (node == (Node *)0x0) {
            node_00 = prvTidypop(stack);
          }
        }
        if (node_00->content == (Node *)0x0) goto LAB_0014a0a1;
        prvTidypush(stack,node);
        node_00 = node_00->content;
      } while( true );
    }
  }
  return;
}

Assistant:

void TY_(CleanStyle)(TidyDocImpl* doc, Node *html)
{
    Node *head = NULL, *body = NULL;
    Bool fix = cfgBool(doc, TidyStyleTags);

    if (!html)
        return; /* oops, not given a start node */

    head = TY_(FindHEAD)( doc );
    body = TY_(FindBody)( doc );

    if ((head != NULL) && (body != NULL))
    {
		StyleToHead(doc, head, body, fix, 0); /* found head and body */
    }
}